

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O2

int mk_channel_write(mk_channel *channel,size_t *count)

{
  mk_list **in;
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_iov *mk_io;
  int iVar3;
  int *piVar4;
  size_t bytes;
  
  piVar4 = __errno_location();
  *piVar4 = 0;
  pmVar1 = (channel->streams).next;
  if (pmVar1 == &channel->streams) {
    return 8;
  }
  pmVar2 = pmVar1[-1].next;
  if (pmVar2 == pmVar1 + -1) {
    return 8;
  }
  if (channel->type != 0) {
    return 2;
  }
  in = &pmVar2[-5].next;
  iVar3 = *(int *)in;
  if (iVar3 == 0) {
    iVar3 = mk_net_conn_write(channel,pmVar2[-3].next,(size_t)pmVar2[-4].next);
    bytes = (size_t)iVar3;
  }
  else if (iVar3 == 1) {
    mk_io = (mk_iov *)pmVar2[-3].next;
    if (mk_io == (mk_iov *)0x0) {
      return 8;
    }
    iVar3 = (*channel->io->writev)(channel->io->plugin,channel->fd,mk_io);
    bytes = (size_t)iVar3;
    if (0 < iVar3) {
      mk_iov_consume(mk_io,bytes);
    }
  }
  else {
    if (iVar3 != 2) goto LAB_00108bdf;
    bytes = channel_write_in_file(channel,(mk_stream_input *)in);
  }
  if (0 < (long)bytes) {
    *count = bytes;
    pmVar2[-4].next = (mk_list *)((long)pmVar2[-4].next - bytes);
    if (pmVar1[-2].prev != (mk_list *)0x0) {
      (*(code *)pmVar1[-2].prev)(&pmVar1[-6].next);
    }
    if (pmVar2[-2].next != (mk_list *)0x0) {
      (*(code *)pmVar2[-2].next)(in,bytes);
    }
    if (pmVar2[-4].next == (mk_list *)0x0) {
      mk_stream_in_release((mk_stream_input *)in);
    }
    if (pmVar1[-1].next != pmVar1 + -1) {
      return 4;
    }
    if (pmVar1[-3].next != (mk_list *)0x0) {
      (*(code *)pmVar1[-3].next)(&pmVar1[-6].next);
    }
    return (uint)((channel->streams).next != &channel->streams) * 3 + 1;
  }
  if (((long)bytes < 0) && (*piVar4 == 0xb)) {
    return 0x10;
  }
LAB_00108bdf:
  mk_stream_in_release((mk_stream_input *)in);
  return 2;
}

Assistant:

int mk_channel_write(struct mk_channel *channel, size_t *count)
{
    ssize_t bytes = -1;
    struct mk_iov *iov;
    struct mk_stream *stream = NULL;
    struct mk_stream_input *input;

    errno = 0;

    if (mk_list_is_empty(&channel->streams) == 0) {
        MK_TRACE("[CH %i] CHANNEL_EMPTY", channel->fd);
        return MK_CHANNEL_EMPTY;
    }

    /* Get the input source */
    stream = mk_list_entry_first(&channel->streams, struct mk_stream, _head);
    if (mk_list_is_empty(&stream->inputs) == 0) {
        return MK_CHANNEL_EMPTY;
    }
    input = mk_list_entry_first(&stream->inputs, struct mk_stream_input, _head);

    /*
     * Based on the Stream Input type we consume on that way, not all inputs
     * requires to read from buffer, e.g: Static File, Pipes.
     */
    if (channel->type == MK_CHANNEL_SOCKET) {
        if (input->type == MK_STREAM_FILE) {
            bytes = channel_write_in_file(channel, input);
        }
        else if (input->type == MK_STREAM_IOV) {
            iov   = input->buffer;
            if (!iov) {
                return MK_CHANNEL_EMPTY;
            }

            bytes = mk_sched_conn_writev(channel, iov);

            MK_TRACE("[CH %i] STREAM_IOV, wrote %d bytes",
                     channel->fd, bytes);
            if (bytes > 0) {
                /* Perform the adjustment on mk_iov */
                mk_iov_consume(iov, bytes);
            }
        }
        else if (input->type == MK_STREAM_RAW) {
            bytes = mk_sched_conn_write(channel,
                                        input->buffer, input->bytes_total);
            MK_TRACE("[CH %i] STREAM_RAW, bytes=%lu/%lu",
                     channel->fd, bytes, input->bytes_total);
            if (bytes > 0) {
                /* DEPRECATED: consume_raw(input, bytes); */
            }
        }

        if (bytes > 0) {
            *count = bytes;
            mk_stream_input_consume(input, bytes);

            /* notification callback, optional */
            if (stream->cb_bytes_consumed) {
                stream->cb_bytes_consumed(stream, bytes);
            }

            if (input->cb_consumed) {
                input->cb_consumed(input, bytes);
            }

            if (input->bytes_total == 0) {
                MK_TRACE("Input done, unlinking (channel=%p)", channel);
                mk_stream_in_release(input);
            }

            if (mk_list_is_empty(&stream->inputs) == 0) {
                /* Everytime the stream is empty, we notify the trigger the cb */
                if (stream->cb_finished) {
                    stream->cb_finished(stream);
                }

                if (mk_channel_is_empty(channel) == 0) {
                    MK_TRACE("[CH %i] CHANNEL_DONE", channel->fd);
                    return MK_CHANNEL_DONE;
                }
                else {
                    MK_TRACE("[CH %i] CHANNEL_FLUSH", channel->fd);
                    return MK_CHANNEL_FLUSH;
                }
            }

            MK_TRACE("[CH %i] CHANNEL_FLUSH", channel->fd);
            return MK_CHANNEL_FLUSH;
        }
        else if (bytes < 0) {
            if (errno == EAGAIN) {
                return MK_CHANNEL_BUSY;
            }

            mk_stream_in_release(input);
            return MK_CHANNEL_ERROR;
        }
        else if (bytes == 0) {
            mk_stream_in_release(input);
            return MK_CHANNEL_ERROR;
        }
    }

    return MK_CHANNEL_ERROR;
}